

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_permute_axes<unsigned_int>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,char *axes_order,
          uint *param_2)

{
  byte bVar1;
  uint size_z;
  uint size_x;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  CImgArgumentException *this_00;
  uint *puVar8;
  byte bVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  CImg<unsigned_int> *pCVar17;
  uint uVar18;
  uint *puVar19;
  long lVar20;
  long lVar21;
  char *pcVar22;
  ulong uVar23;
  uint *puVar24;
  long lVar25;
  char cVar26;
  char cVar38;
  char cVar39;
  char cVar40;
  undefined1 auVar29 [16];
  undefined1 auVar34 [16];
  undefined1 local_68 [16];
  bool local_58;
  uint *local_50;
  uchar s_code [4];
  uchar n_code [4];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar27 [12];
  undefined1 auVar30 [16];
  undefined1 auVar28 [13];
  undefined1 auVar31 [16];
  undefined1 auVar37 [16];
  undefined1 auVar33 [16];
  undefined1 auVar32 [16];
  undefined2 uVar41;
  
  puVar24 = this->_data;
  uVar15 = this->_width;
  uVar18 = this->_height;
  size_z = this->_depth;
  if (((size_z == 0 || uVar18 == 0) || (uVar15 == 0 || puVar24 == (uint *)0x0)) ||
     (size_x = this->_spectrum, axes_order == (char *)0x0 || size_x == 0)) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  local_50 = (uint *)0x0;
  local_68 = ZEXT816(0);
  local_58 = false;
  s_code[0] = '\0';
  s_code[1] = '\x01';
  s_code[2] = '\x02';
  s_code[3] = '\x03';
  n_code[0] = '\0';
  n_code[1] = '\0';
  n_code[2] = '\0';
  n_code[3] = '\0';
  bVar1 = *axes_order;
  if (bVar1 == 0) {
    bVar9 = 0;
    pCVar17 = __return_storage_ptr__;
  }
  else {
    lVar10 = 0;
    bVar9 = bVar1;
    do {
      pCVar17 = (CImg<unsigned_int> *)(ulong)bVar9;
      bVar13 = bVar9 + 0x20;
      if ((byte)(bVar9 + 0xa5) < 0xe6) {
        bVar13 = bVar9;
      }
      if (lVar10 == 4) {
LAB_0019e98f:
        s_code[0] = '\x04';
        bVar9 = 4;
        goto LAB_0019e996;
      }
      pCVar17 = (CImg<unsigned_int> *)(ulong)(bVar13 - 0x78);
      if ((2 < bVar13 - 0x78) && (bVar13 != 99)) goto LAB_0019e98f;
      uVar14 = bVar13 & 3;
      n_code[uVar14] = n_code[uVar14] + '\x01';
      s_code[lVar10] = (uchar)uVar14;
      bVar9 = axes_order[lVar10 + 1];
      lVar10 = lVar10 + 1;
    } while (bVar9 != 0);
    bVar9 = s_code[0];
  }
LAB_0019e996:
  bVar13 = n_code[0];
  bVar2 = n_code[1];
  bVar3 = n_code[2];
  bVar4 = n_code[3];
  cVar26 = -((byte)((bVar13 == 0) * bVar13 | bVar13 != 0) == bVar13);
  cVar38 = -((byte)((bVar2 == 0) * bVar2 | bVar2 != 0) == bVar2);
  cVar39 = -((byte)((bVar3 == 0) * bVar3 | bVar3 != 0) == bVar3);
  cVar40 = -((byte)((bVar4 == 0) * bVar4 | bVar4 != 0) == bVar4);
  auVar27._0_11_ = ZEXT411(0xffffffff) << 0x38;
  auVar27[0xb] = 0xff;
  auVar28[0xc] = 0xff;
  auVar28._0_12_ = auVar27;
  auVar33[0xd] = 0xff;
  auVar33._0_13_ = auVar28;
  auVar33[0xe] = 0xff;
  auVar33[0xf] = 0xff;
  auVar32._14_2_ = auVar33._14_2_;
  auVar32[0xd] = 0xff;
  auVar32._0_13_ = auVar28;
  auVar31._13_3_ = auVar32._13_3_;
  auVar31[0xc] = 0xff;
  auVar31._0_12_ = auVar27;
  auVar30._12_4_ = auVar31._12_4_;
  auVar30[0xb] = 0xff;
  auVar30._0_11_ = auVar27._0_11_;
  Var7 = CONCAT91(CONCAT81((long)(CONCAT72((int7)(CONCAT63((int6)(CONCAT54(auVar30._11_5_,0xffffffff
                                                                          ) >> 0x18),0xffffff) >>
                                                 0x10),0xffff) >> 8),cVar40),cVar40);
  auVar6._2_10_ = Var7;
  auVar6[1] = cVar39;
  auVar6[0] = cVar39;
  auVar5._2_12_ = auVar6;
  auVar5[1] = cVar38;
  auVar5[0] = cVar38;
  auVar29._0_2_ = CONCAT11(cVar26,cVar26);
  auVar29._2_14_ = auVar5;
  uVar41 = (undefined2)Var7;
  auVar37._0_12_ = auVar29._0_12_;
  auVar37._12_2_ = uVar41;
  auVar37._14_2_ = uVar41;
  auVar36._12_4_ = auVar37._12_4_;
  auVar36._0_10_ = auVar29._0_10_;
  auVar36._10_2_ = auVar6._0_2_;
  auVar35._10_6_ = auVar36._10_6_;
  auVar35._0_8_ = auVar29._0_8_;
  auVar35._8_2_ = auVar6._0_2_;
  auVar34._8_8_ = auVar35._8_8_;
  auVar34._6_2_ = auVar5._0_2_;
  auVar34._4_2_ = auVar5._0_2_;
  auVar34._2_2_ = auVar29._0_2_;
  auVar34._0_2_ = auVar29._0_2_;
  iVar16 = movmskps((int)pCVar17,auVar34);
  if ((3 < bVar9 || bVar1 == 0) || iVar16 != 0xf) goto LAB_0019fc37;
  uVar14 = (uint)s_code >> 0x18 | ((uint)s_code >> 0x10 & 0xff) << 4 |
           ((uint)s_code >> 8 & 0xff) << 8 | (uint)bVar9 << 0xc;
  if (0x2012 < uVar14) {
    if (uVar14 < 0x3012) {
      if (uVar14 < 0x2130) {
        if (uVar14 == 0x2013) {
          assign((CImg<unsigned_int> *)local_68,size_z,uVar15,uVar18,size_x);
          uVar15 = this->_spectrum;
          if (0 < (int)uVar15) {
            uVar18 = this->_depth;
            lVar10 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar15 = this->_height;
                iVar16 = 0;
                do {
                  if (0 < (int)uVar15) {
                    uVar18 = this->_width;
                    lVar21 = 0;
                    do {
                      if (0 < (int)uVar18) {
                        iVar11 = 0;
                        do {
                          uVar15 = *puVar24;
                          puVar24 = puVar24 + 1;
                          local_50[(ulong)(uint)local_68._8_4_ *
                                   (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ *
                                   lVar10 + (ulong)(uint)local_68._4_4_ *
                                            (ulong)(uint)local_68._0_4_ * lVar21 +
                                            (ulong)(uint)(local_68._0_4_ * iVar11 + iVar16)] =
                               uVar15;
                          iVar11 = iVar11 + 1;
                          uVar18 = this->_width;
                        } while (iVar11 < (int)uVar18);
                        uVar15 = this->_height;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 < (int)uVar15);
                    uVar18 = this->_depth;
                  }
                  iVar16 = iVar16 + 1;
                } while (iVar16 < (int)uVar18);
                uVar15 = this->_spectrum;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)uVar15);
          }
        }
        else if (uVar14 == 0x2031) {
          assign((CImg<unsigned_int> *)local_68,size_z,uVar15,size_x,uVar18);
          uVar15 = this->_spectrum;
          if (0 < (int)uVar15) {
            uVar18 = this->_depth;
            lVar10 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar15 = this->_height;
                iVar16 = 0;
                do {
                  if (0 < (int)uVar15) {
                    uVar18 = this->_width;
                    lVar21 = 0;
                    do {
                      if (0 < (int)uVar18) {
                        iVar11 = 0;
                        do {
                          uVar15 = *puVar24;
                          puVar24 = puVar24 + 1;
                          local_50[(ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ *
                                   lVar10 + (ulong)(uint)local_68._8_4_ *
                                            (ulong)(uint)local_68._4_4_ *
                                            (ulong)(uint)local_68._0_4_ * lVar21 +
                                            (ulong)(uint)(local_68._0_4_ * iVar11 + iVar16)] =
                               uVar15;
                          iVar11 = iVar11 + 1;
                          uVar18 = this->_width;
                        } while (iVar11 < (int)uVar18);
                        uVar15 = this->_height;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 < (int)uVar15);
                    uVar18 = this->_depth;
                  }
                  iVar16 = iVar16 + 1;
                } while (iVar16 < (int)uVar18);
                uVar15 = this->_spectrum;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)uVar15);
          }
        }
        else if (uVar14 == 0x2103) {
          assign((CImg<unsigned_int> *)local_68,size_z,uVar18,uVar15,size_x);
          uVar15 = this->_spectrum;
          if (0 < (int)uVar15) {
            uVar18 = this->_depth;
            lVar10 = 0;
            lVar21 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar15 = this->_height;
                iVar16 = 0;
                do {
                  if (0 < (int)uVar15) {
                    uVar23 = (ulong)this->_width;
                    iVar11 = 0;
                    do {
                      if (0 < (int)uVar23) {
                        lVar25 = 0;
                        lVar12 = 0;
                        lVar20 = (long)local_50 + lVar10;
                        do {
                          *(uint *)(lVar20 + (ulong)(uint)(local_68._0_4_ * iVar11 + iVar16) * 4) =
                               puVar24[lVar12];
                          lVar12 = lVar12 + 1;
                          uVar23 = (ulong)(int)this->_width;
                          lVar20 = lVar20 + (ulong)(uint)local_68._4_4_ *
                                            (ulong)(uint)local_68._0_4_ * 4;
                          lVar25 = lVar25 + 4;
                        } while (lVar12 < (long)uVar23);
                        uVar15 = this->_height;
                        puVar24 = (uint *)((long)puVar24 + lVar25);
                      }
                      iVar11 = iVar11 + 1;
                    } while (iVar11 < (int)uVar15);
                    uVar18 = this->_depth;
                  }
                  iVar16 = iVar16 + 1;
                } while (iVar16 < (int)uVar18);
                uVar15 = this->_spectrum;
              }
              lVar21 = lVar21 + 1;
              lVar10 = lVar10 + (ulong)(uint)local_68._8_4_ *
                                (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * 4;
            } while (lVar21 < (int)uVar15);
          }
        }
      }
      else if (uVar14 == 0x2130) {
        assign((CImg<unsigned_int> *)local_68,size_z,uVar18,size_x,uVar15);
        uVar15 = this->_spectrum;
        if (0 < (int)uVar15) {
          uVar18 = this->_depth;
          lVar10 = 0;
          lVar21 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar15 = this->_height;
              iVar16 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar23 = (ulong)this->_width;
                  iVar11 = 0;
                  do {
                    if (0 < (int)uVar23) {
                      lVar25 = 0;
                      lVar12 = 0;
                      lVar20 = (long)local_50 + lVar10;
                      do {
                        *(uint *)(lVar20 + (ulong)(uint)(local_68._0_4_ * iVar11 + iVar16) * 4) =
                             puVar24[lVar12];
                        lVar12 = lVar12 + 1;
                        uVar23 = (ulong)(int)this->_width;
                        lVar20 = lVar20 + (ulong)(uint)local_68._8_4_ *
                                          (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_
                                          * 4;
                        lVar25 = lVar25 + 4;
                      } while (lVar12 < (long)uVar23);
                      uVar15 = this->_height;
                      puVar24 = (uint *)((long)puVar24 + lVar25);
                    }
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)uVar15);
                  uVar18 = this->_depth;
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 < (int)uVar18);
              uVar15 = this->_spectrum;
            }
            lVar21 = lVar21 + 1;
            lVar10 = lVar10 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * 4;
          } while (lVar21 < (int)uVar15);
        }
      }
      else if (uVar14 == 0x2301) {
        assign((CImg<unsigned_int> *)local_68,size_z,size_x,uVar15,uVar18);
        uVar15 = this->_spectrum;
        if (0 < (int)uVar15) {
          uVar18 = this->_depth;
          iVar16 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar15 = this->_height;
              iVar11 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar23 = (ulong)this->_width;
                  lVar10 = 0;
                  puVar8 = local_50;
                  do {
                    if (0 < (int)uVar23) {
                      lVar21 = 0;
                      lVar20 = 0;
                      puVar19 = puVar8;
                      do {
                        puVar19[(uint)(local_68._0_4_ * iVar16 + iVar11)] = puVar24[lVar20];
                        lVar20 = lVar20 + 1;
                        uVar23 = (ulong)(int)this->_width;
                        puVar19 = puVar19 + (ulong)(uint)local_68._4_4_ *
                                            (ulong)(uint)local_68._0_4_;
                        lVar21 = lVar21 + 4;
                      } while (lVar20 < (long)uVar23);
                      uVar15 = this->_height;
                      puVar24 = (uint *)((long)puVar24 + lVar21);
                    }
                    lVar10 = lVar10 + 1;
                    puVar8 = puVar8 + (ulong)(uint)local_68._8_4_ *
                                      (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_;
                  } while (lVar10 < (int)uVar15);
                  uVar18 = this->_depth;
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)uVar18);
              uVar15 = this->_spectrum;
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < (int)uVar15);
        }
      }
      else if (uVar14 == 0x2310) {
        assign((CImg<unsigned_int> *)local_68,size_z,size_x,uVar18,uVar15);
        uVar15 = this->_spectrum;
        if (0 < (int)uVar15) {
          uVar18 = this->_depth;
          iVar16 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar15 = this->_height;
              iVar11 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar23 = (ulong)this->_width;
                  lVar10 = 0;
                  puVar8 = local_50;
                  do {
                    if (0 < (int)uVar23) {
                      lVar21 = 0;
                      lVar20 = 0;
                      puVar19 = puVar8;
                      do {
                        puVar19[(uint)(local_68._0_4_ * iVar16 + iVar11)] = puVar24[lVar20];
                        lVar20 = lVar20 + 1;
                        uVar23 = (ulong)(int)this->_width;
                        puVar19 = puVar19 + (ulong)(uint)local_68._8_4_ *
                                            (ulong)(uint)local_68._4_4_ *
                                            (ulong)(uint)local_68._0_4_;
                        lVar21 = lVar21 + 4;
                      } while (lVar20 < (long)uVar23);
                      uVar15 = this->_height;
                      puVar24 = (uint *)((long)puVar24 + lVar21);
                    }
                    lVar10 = lVar10 + 1;
                    puVar8 = puVar8 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_;
                  } while (lVar10 < (int)uVar15);
                  uVar18 = this->_depth;
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)uVar18);
              uVar15 = this->_spectrum;
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < (int)uVar15);
        }
      }
    }
    else if (uVar14 < 0x3120) {
      if (uVar14 == 0x3012) {
        assign((CImg<unsigned_int> *)local_68,size_x,uVar15,uVar18,size_z);
        uVar15 = this->_spectrum;
        switch(uVar15) {
        case 1:
          lVar10 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar10 != 0) {
            puVar24 = this->_data;
            lVar21 = 0;
            do {
              local_50[lVar21] = puVar24[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar10 - lVar21 != 0);
          }
          break;
        case 2:
          lVar10 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar10 != 0) {
            puVar24 = this->_data;
            lVar21 = 0;
            do {
              local_50[lVar21 * 2] = puVar24[lVar21];
              local_50[lVar21 * 2 + 1] = puVar24[lVar10 + lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar10 - lVar21 != 0);
          }
          break;
        case 3:
          lVar10 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar10 != 0) {
            puVar24 = this->_data;
            lVar21 = 0;
            puVar8 = local_50;
            do {
              *puVar8 = puVar24[lVar21];
              puVar8[1] = puVar24[lVar10 + lVar21];
              puVar8[2] = puVar24[lVar10 * 2 + lVar21];
              puVar8 = puVar8 + 3;
              lVar21 = lVar21 + 1;
            } while (lVar10 - lVar21 != 0);
          }
          break;
        case 4:
          lVar10 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar10 != 0) {
            puVar24 = this->_data;
            lVar21 = 0;
            puVar8 = local_50;
            do {
              *puVar8 = puVar24[lVar21];
              puVar8[1] = puVar24[lVar10 + lVar21];
              puVar8[2] = puVar24[lVar10 * 2 + lVar21];
              puVar8[3] = puVar24[lVar10 * 3 + lVar21];
              puVar8 = puVar8 + 4;
              lVar21 = lVar21 + 1;
            } while (lVar10 - lVar21 != 0);
          }
          break;
        default:
          if (0 < (int)uVar15) {
            uVar18 = this->_depth;
            iVar16 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar15 = this->_height;
                lVar10 = 0;
                do {
                  if (0 < (int)uVar15) {
                    uVar18 = this->_width;
                    lVar21 = 0;
                    do {
                      if (0 < (int)uVar18) {
                        iVar11 = 0;
                        do {
                          uVar15 = *puVar24;
                          puVar24 = puVar24 + 1;
                          local_50[(ulong)(uint)local_68._8_4_ *
                                   (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ *
                                   lVar10 + (ulong)(uint)local_68._4_4_ *
                                            (ulong)(uint)local_68._0_4_ * lVar21 +
                                            (ulong)(uint)(local_68._0_4_ * iVar11 + iVar16)] =
                               uVar15;
                          iVar11 = iVar11 + 1;
                          uVar18 = this->_width;
                        } while (iVar11 < (int)uVar18);
                        uVar15 = this->_height;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 < (int)uVar15);
                    uVar18 = this->_depth;
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 < (int)uVar18);
                uVar15 = this->_spectrum;
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 < (int)uVar15);
          }
        }
      }
      else if (uVar14 == 0x3021) {
        assign((CImg<unsigned_int> *)local_68,size_x,uVar15,size_z,uVar18);
        uVar15 = this->_spectrum;
        if (0 < (int)uVar15) {
          uVar18 = this->_depth;
          iVar16 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar15 = this->_height;
              lVar10 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar18 = this->_width;
                  lVar21 = 0;
                  do {
                    if (0 < (int)uVar18) {
                      iVar11 = 0;
                      do {
                        uVar15 = *puVar24;
                        puVar24 = puVar24 + 1;
                        local_50[(ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar10
                                 + (ulong)(uint)local_68._8_4_ *
                                   (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ *
                                   lVar21 + (ulong)(uint)(local_68._0_4_ * iVar11 + iVar16)] =
                             uVar15;
                        iVar11 = iVar11 + 1;
                        uVar18 = this->_width;
                      } while (iVar11 < (int)uVar18);
                      uVar15 = this->_height;
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar21 < (int)uVar15);
                  uVar18 = this->_depth;
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 < (int)uVar18);
              uVar15 = this->_spectrum;
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < (int)uVar15);
        }
      }
      else if (uVar14 == 0x3102) {
        assign((CImg<unsigned_int> *)local_68,size_x,uVar18,uVar15,size_z);
        uVar15 = this->_spectrum;
        if (0 < (int)uVar15) {
          uVar18 = this->_depth;
          iVar16 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar15 = this->_height;
              lVar10 = 0;
              lVar21 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar23 = (ulong)this->_width;
                  iVar11 = 0;
                  do {
                    if (0 < (int)uVar23) {
                      lVar25 = 0;
                      lVar12 = 0;
                      lVar20 = (long)local_50 + lVar10;
                      do {
                        *(uint *)(lVar20 + (ulong)(uint)(local_68._0_4_ * iVar11 + iVar16) * 4) =
                             puVar24[lVar12];
                        lVar12 = lVar12 + 1;
                        uVar23 = (ulong)(int)this->_width;
                        lVar20 = lVar20 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_
                                          * 4;
                        lVar25 = lVar25 + 4;
                      } while (lVar12 < (long)uVar23);
                      uVar15 = this->_height;
                      puVar24 = (uint *)((long)puVar24 + lVar25);
                    }
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)uVar15);
                  uVar18 = this->_depth;
                }
                lVar21 = lVar21 + 1;
                lVar10 = lVar10 + (ulong)(uint)local_68._8_4_ *
                                  (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * 4;
              } while (lVar21 < (int)uVar18);
              uVar15 = this->_spectrum;
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < (int)uVar15);
        }
      }
    }
    else if (uVar14 == 0x3120) {
      assign((CImg<unsigned_int> *)local_68,size_x,uVar18,size_z,uVar15);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        iVar16 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            lVar10 = 0;
            lVar21 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar23 = (ulong)this->_width;
                iVar11 = 0;
                do {
                  if (0 < (int)uVar23) {
                    lVar25 = 0;
                    lVar12 = 0;
                    lVar20 = (long)local_50 + lVar10;
                    do {
                      *(uint *)(lVar20 + (ulong)(uint)(local_68._0_4_ * iVar11 + iVar16) * 4) =
                           puVar24[lVar12];
                      lVar12 = lVar12 + 1;
                      uVar23 = (ulong)(int)this->_width;
                      lVar20 = lVar20 + (ulong)(uint)local_68._8_4_ *
                                        (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ *
                                        4;
                      lVar25 = lVar25 + 4;
                    } while (lVar12 < (long)uVar23);
                    uVar15 = this->_height;
                    puVar24 = (uint *)((long)puVar24 + lVar25);
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 < (int)uVar15);
                uVar18 = this->_depth;
              }
              lVar21 = lVar21 + 1;
              lVar10 = lVar10 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * 4;
            } while (lVar21 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < (int)uVar15);
      }
    }
    else if (uVar14 == 0x3201) {
      assign((CImg<unsigned_int> *)local_68,size_x,size_z,uVar15,uVar18);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        iVar16 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            iVar11 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar23 = (ulong)this->_width;
                lVar10 = 0;
                puVar8 = local_50;
                do {
                  if (0 < (int)uVar23) {
                    lVar21 = 0;
                    lVar20 = 0;
                    puVar19 = puVar8;
                    do {
                      puVar19[(uint)(local_68._0_4_ * iVar11 + iVar16)] = puVar24[lVar20];
                      lVar20 = lVar20 + 1;
                      uVar23 = (ulong)(int)this->_width;
                      puVar19 = puVar19 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_;
                      lVar21 = lVar21 + 4;
                    } while (lVar20 < (long)uVar23);
                    uVar15 = this->_height;
                    puVar24 = (uint *)((long)puVar24 + lVar21);
                  }
                  lVar10 = lVar10 + 1;
                  puVar8 = puVar8 + (ulong)(uint)local_68._8_4_ *
                                    (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_;
                } while (lVar10 < (int)uVar15);
                uVar18 = this->_depth;
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < (int)uVar15);
      }
    }
    else if (uVar14 == 0x3210) {
      assign((CImg<unsigned_int> *)local_68,size_x,size_z,uVar18,uVar15);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        iVar16 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            iVar11 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar23 = (ulong)this->_width;
                lVar10 = 0;
                puVar8 = local_50;
                do {
                  if (0 < (int)uVar23) {
                    lVar21 = 0;
                    lVar20 = 0;
                    puVar19 = puVar8;
                    do {
                      puVar19[(uint)(local_68._0_4_ * iVar11 + iVar16)] = puVar24[lVar20];
                      lVar20 = lVar20 + 1;
                      uVar23 = (ulong)(int)this->_width;
                      puVar19 = puVar19 + (ulong)(uint)local_68._8_4_ *
                                          (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_;
                      lVar21 = lVar21 + 4;
                    } while (lVar20 < (long)uVar23);
                    uVar15 = this->_height;
                    puVar24 = (uint *)((long)puVar24 + lVar21);
                  }
                  lVar10 = lVar10 + 1;
                  puVar8 = puVar8 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_;
                } while (lVar10 < (int)uVar15);
                uVar18 = this->_depth;
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < (int)uVar15);
      }
    }
    goto LAB_0019fc37;
  }
  if (uVar14 < 0x1023) {
    if (uVar14 < 0x231) {
      if (uVar14 == 0x123) {
        CImg(__return_storage_ptr__,this,false);
        if ((local_58 & 1U) != 0) {
          return __return_storage_ptr__;
        }
        goto LAB_0019fc75;
      }
      if (uVar14 == 0x132) {
        assign((CImg<unsigned_int> *)local_68,uVar15,uVar18,size_x,size_z);
        uVar15 = this->_spectrum;
        if (0 < (int)uVar15) {
          uVar18 = this->_depth;
          lVar10 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar15 = this->_height;
              lVar21 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar18 = this->_width;
                  iVar16 = 0;
                  do {
                    if (0 < (int)uVar18) {
                      iVar11 = 0;
                      do {
                        uVar15 = *puVar24;
                        puVar24 = puVar24 + 1;
                        local_50[(ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar10
                                 + (ulong)(uint)local_68._8_4_ *
                                   (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ *
                                   lVar21 + (ulong)(uint)(local_68._0_4_ * iVar16 + iVar11)] =
                             uVar15;
                        iVar11 = iVar11 + 1;
                        uVar18 = this->_width;
                      } while (iVar11 < (int)uVar18);
                      uVar15 = this->_height;
                    }
                    iVar16 = iVar16 + 1;
                  } while (iVar16 < (int)uVar15);
                  uVar18 = this->_depth;
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 < (int)uVar18);
              uVar15 = this->_spectrum;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < (int)uVar15);
        }
      }
      else if (uVar14 == 0x213) {
        assign((CImg<unsigned_int> *)local_68,uVar15,size_z,uVar18,size_x);
        uVar15 = this->_spectrum;
        if (0 < (int)uVar15) {
          uVar18 = this->_depth;
          lVar10 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar15 = this->_height;
              iVar16 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar18 = this->_width;
                  lVar21 = 0;
                  do {
                    if (0 < (int)uVar18) {
                      iVar11 = 0;
                      do {
                        uVar15 = *puVar24;
                        puVar24 = puVar24 + 1;
                        local_50[(ulong)(uint)local_68._8_4_ *
                                 (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar10
                                 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ *
                                   lVar21 + (ulong)(uint)(local_68._0_4_ * iVar16 + iVar11)] =
                             uVar15;
                        iVar11 = iVar11 + 1;
                        uVar18 = this->_width;
                      } while (iVar11 < (int)uVar18);
                      uVar15 = this->_height;
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar21 < (int)uVar15);
                  uVar18 = this->_depth;
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 < (int)uVar18);
              uVar15 = this->_spectrum;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < (int)uVar15);
        }
      }
    }
    else if (uVar14 == 0x231) {
      assign((CImg<unsigned_int> *)local_68,uVar15,size_z,size_x,uVar18);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        lVar10 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            iVar16 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar18 = this->_width;
                lVar21 = 0;
                do {
                  if (0 < (int)uVar18) {
                    iVar11 = 0;
                    do {
                      uVar15 = *puVar24;
                      puVar24 = puVar24 + 1;
                      local_50[(ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar10 +
                               (ulong)(uint)local_68._8_4_ *
                               (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar21 +
                               (ulong)(uint)(local_68._0_4_ * iVar16 + iVar11)] = uVar15;
                      iVar11 = iVar11 + 1;
                      uVar18 = this->_width;
                    } while (iVar11 < (int)uVar18);
                    uVar15 = this->_height;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 < (int)uVar15);
                uVar18 = this->_depth;
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar15);
      }
    }
    else if (uVar14 == 0x312) {
      assign((CImg<unsigned_int> *)local_68,uVar15,size_x,uVar18,size_z);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        iVar16 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            lVar10 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar18 = this->_width;
                lVar21 = 0;
                do {
                  if (0 < (int)uVar18) {
                    iVar11 = 0;
                    do {
                      uVar15 = *puVar24;
                      puVar24 = puVar24 + 1;
                      local_50[(ulong)(uint)local_68._8_4_ *
                               (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar10 +
                               (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar21 +
                               (ulong)(uint)(local_68._0_4_ * iVar16 + iVar11)] = uVar15;
                      iVar11 = iVar11 + 1;
                      uVar18 = this->_width;
                    } while (iVar11 < (int)uVar18);
                    uVar15 = this->_height;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 < (int)uVar15);
                uVar18 = this->_depth;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < (int)uVar15);
      }
    }
    else if (uVar14 == 0x321) {
      assign((CImg<unsigned_int> *)local_68,uVar15,size_x,size_z,uVar18);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        iVar16 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            lVar10 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar18 = this->_width;
                lVar21 = 0;
                do {
                  if (0 < (int)uVar18) {
                    iVar11 = 0;
                    do {
                      uVar15 = *puVar24;
                      puVar24 = puVar24 + 1;
                      local_50[(ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar10 +
                               (ulong)(uint)local_68._8_4_ *
                               (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar21 +
                               (ulong)(uint)(local_68._0_4_ * iVar16 + iVar11)] = uVar15;
                      iVar11 = iVar11 + 1;
                      uVar18 = this->_width;
                    } while (iVar11 < (int)uVar18);
                    uVar15 = this->_height;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 < (int)uVar15);
                uVar18 = this->_depth;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < (int)uVar15);
      }
    }
    goto LAB_0019fc37;
  }
  if (uVar14 < 0x1230) {
    if (uVar14 == 0x1023) {
      assign((CImg<unsigned_int> *)local_68,uVar18,uVar15,size_z,size_x);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        lVar10 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            lVar21 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar18 = this->_width;
                iVar16 = 0;
                do {
                  if (0 < (int)uVar18) {
                    iVar11 = 0;
                    do {
                      uVar15 = *puVar24;
                      puVar24 = puVar24 + 1;
                      local_50[(ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar21 +
                               (ulong)(uint)local_68._8_4_ *
                               (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar10 +
                               (ulong)(uint)(local_68._0_4_ * iVar11 + iVar16)] = uVar15;
                      iVar11 = iVar11 + 1;
                      uVar18 = this->_width;
                    } while (iVar11 < (int)uVar18);
                    uVar15 = this->_height;
                  }
                  iVar16 = iVar16 + 1;
                } while (iVar16 < (int)uVar15);
                uVar18 = this->_depth;
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar15);
      }
    }
    else if (uVar14 == 0x1032) {
      assign((CImg<unsigned_int> *)local_68,uVar18,uVar15,size_x,size_z);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        lVar10 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            lVar21 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar18 = this->_width;
                iVar16 = 0;
                do {
                  if (0 < (int)uVar18) {
                    iVar11 = 0;
                    do {
                      uVar15 = *puVar24;
                      puVar24 = puVar24 + 1;
                      local_50[(ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar10 +
                               (ulong)(uint)local_68._8_4_ *
                               (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * lVar21 +
                               (ulong)(uint)(local_68._0_4_ * iVar11 + iVar16)] = uVar15;
                      iVar11 = iVar11 + 1;
                      uVar18 = this->_width;
                    } while (iVar11 < (int)uVar18);
                    uVar15 = this->_height;
                  }
                  iVar16 = iVar16 + 1;
                } while (iVar16 < (int)uVar15);
                uVar18 = this->_depth;
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar15);
      }
    }
    else if (uVar14 == 0x1203) {
      assign((CImg<unsigned_int> *)local_68,uVar18,size_z,uVar15,size_x);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        lVar10 = 0;
        lVar21 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            iVar16 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar23 = (ulong)this->_width;
                iVar11 = 0;
                do {
                  if (0 < (int)uVar23) {
                    lVar25 = 0;
                    lVar12 = 0;
                    lVar20 = (long)local_50 + lVar10;
                    do {
                      *(uint *)(lVar20 + (ulong)(uint)(local_68._0_4_ * iVar16 + iVar11) * 4) =
                           puVar24[lVar12];
                      lVar12 = lVar12 + 1;
                      uVar23 = (ulong)(int)this->_width;
                      lVar20 = lVar20 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ *
                                        4;
                      lVar25 = lVar25 + 4;
                    } while (lVar12 < (long)uVar23);
                    uVar15 = this->_height;
                    puVar24 = (uint *)((long)puVar24 + lVar25);
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 < (int)uVar15);
                uVar18 = this->_depth;
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          lVar21 = lVar21 + 1;
          lVar10 = lVar10 + (ulong)(uint)local_68._8_4_ *
                            (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * 4;
        } while (lVar21 < (int)uVar15);
      }
    }
    goto LAB_0019fc37;
  }
  if (uVar14 != 0x1230) {
    if (uVar14 == 0x1302) {
      assign((CImg<unsigned_int> *)local_68,uVar18,size_x,uVar15,size_z);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        iVar16 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            lVar10 = 0;
            lVar21 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar23 = (ulong)this->_width;
                iVar11 = 0;
                do {
                  if (0 < (int)uVar23) {
                    lVar25 = 0;
                    lVar12 = 0;
                    lVar20 = (long)local_50 + lVar10;
                    do {
                      *(uint *)(lVar20 + (ulong)(uint)(local_68._0_4_ * iVar16 + iVar11) * 4) =
                           puVar24[lVar12];
                      lVar12 = lVar12 + 1;
                      uVar23 = (ulong)(int)this->_width;
                      lVar20 = lVar20 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ *
                                        4;
                      lVar25 = lVar25 + 4;
                    } while (lVar12 < (long)uVar23);
                    uVar15 = this->_height;
                    puVar24 = (uint *)((long)puVar24 + lVar25);
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 < (int)uVar15);
                uVar18 = this->_depth;
              }
              lVar21 = lVar21 + 1;
              lVar10 = lVar10 + (ulong)(uint)local_68._8_4_ *
                                (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * 4;
            } while (lVar21 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < (int)uVar15);
      }
    }
    else if (uVar14 == 0x1320) {
      assign((CImg<unsigned_int> *)local_68,uVar18,size_x,size_z,uVar15);
      uVar15 = this->_spectrum;
      if (0 < (int)uVar15) {
        uVar18 = this->_depth;
        iVar16 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar15 = this->_height;
            lVar10 = 0;
            lVar21 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar23 = (ulong)this->_width;
                iVar11 = 0;
                do {
                  if (0 < (int)uVar23) {
                    lVar25 = 0;
                    lVar12 = 0;
                    lVar20 = (long)local_50 + lVar10;
                    do {
                      *(uint *)(lVar20 + (ulong)(uint)(local_68._0_4_ * iVar16 + iVar11) * 4) =
                           puVar24[lVar12];
                      lVar12 = lVar12 + 1;
                      uVar23 = (ulong)(int)this->_width;
                      lVar20 = lVar20 + (ulong)(uint)local_68._8_4_ *
                                        (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ *
                                        4;
                      lVar25 = lVar25 + 4;
                    } while (lVar12 < (long)uVar23);
                    uVar15 = this->_height;
                    puVar24 = (uint *)((long)puVar24 + lVar25);
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 < (int)uVar15);
                uVar18 = this->_depth;
              }
              lVar21 = lVar21 + 1;
              lVar10 = lVar10 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * 4;
            } while (lVar21 < (int)uVar18);
            uVar15 = this->_spectrum;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < (int)uVar15);
      }
    }
    goto LAB_0019fc37;
  }
  assign((CImg<unsigned_int> *)local_68,uVar18,size_z,size_x,uVar15);
  uVar23 = (ulong)this->_width;
  switch(this->_width) {
  case 1:
    iVar16 = this->_depth * this->_height * this->_spectrum;
    if (iVar16 != 0) {
      lVar10 = 0;
      do {
        local_50[lVar10] = puVar24[lVar10];
        lVar10 = lVar10 + 1;
      } while (iVar16 != (int)lVar10);
    }
    break;
  case 2:
    iVar16 = this->_depth * this->_height * this->_spectrum;
    if (iVar16 != 0) {
      lVar10 = 0;
      do {
        local_50[lVar10] = puVar24[lVar10 * 2];
        local_50[(ulong)(uint)local_68._8_4_ *
                 (ulong)(uint)local_68._0_4_ * (ulong)(uint)local_68._4_4_ + lVar10] =
             puVar24[lVar10 * 2 + 1];
        lVar10 = lVar10 + 1;
      } while (iVar16 != (int)lVar10);
    }
    break;
  case 3:
    iVar16 = this->_depth * this->_height * this->_spectrum;
    if (iVar16 != 0) {
      lVar10 = (ulong)(uint)local_68._8_4_ *
               (ulong)(uint)local_68._0_4_ * (ulong)(uint)local_68._4_4_;
      lVar21 = 0;
      do {
        local_50[lVar21] = *puVar24;
        local_50[lVar10 + lVar21] = puVar24[1];
        local_50[lVar10 * 2 + lVar21] = puVar24[2];
        puVar24 = puVar24 + 3;
        lVar21 = lVar21 + 1;
      } while (iVar16 != (int)lVar21);
    }
    break;
  case 4:
    iVar16 = this->_depth * this->_height * this->_spectrum;
    if (iVar16 != 0) {
      lVar10 = (ulong)(uint)local_68._8_4_ *
               (ulong)(uint)local_68._0_4_ * (ulong)(uint)local_68._4_4_;
      lVar21 = 0;
      do {
        local_50[lVar21] = *puVar24;
        local_50[lVar10 + lVar21] = puVar24[1];
        local_50[lVar10 * 2 + lVar21] = puVar24[2];
        local_50[lVar10 * 3 + lVar21] = puVar24[3];
        puVar24 = puVar24 + 4;
        lVar21 = lVar21 + 1;
      } while (iVar16 != (int)lVar21);
    }
    break;
  default:
    uVar15 = this->_spectrum;
    if (0 < (int)uVar15) {
      uVar18 = this->_depth;
      lVar10 = 0;
      lVar21 = 0;
      do {
        if (0 < (int)uVar18) {
          uVar15 = this->_height;
          iVar16 = 0;
          do {
            if (0 < (int)uVar15) {
              iVar11 = 0;
              do {
                if (0 < (int)uVar23) {
                  lVar25 = 0;
                  lVar12 = 0;
                  lVar20 = (long)local_50 + lVar10;
                  do {
                    *(uint *)(lVar20 + (ulong)(uint)(local_68._0_4_ * iVar16 + iVar11) * 4) =
                         puVar24[lVar12];
                    lVar12 = lVar12 + 1;
                    uVar23 = (ulong)(int)this->_width;
                    lVar20 = lVar20 + (ulong)(uint)local_68._8_4_ *
                                      (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * 4;
                    lVar25 = lVar25 + 4;
                  } while (lVar12 < (long)uVar23);
                  uVar15 = this->_height;
                  puVar24 = (uint *)((long)puVar24 + lVar25);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)uVar15);
              uVar18 = this->_depth;
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < (int)uVar18);
          uVar15 = this->_spectrum;
        }
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + (ulong)(uint)local_68._4_4_ * (ulong)(uint)local_68._0_4_ * 4;
      } while (lVar21 < (int)uVar15);
    }
    __return_storage_ptr__->_width = local_68._0_4_;
    __return_storage_ptr__->_height = local_68._4_4_;
    __return_storage_ptr__->_depth = local_68._8_4_;
    __return_storage_ptr__->_spectrum = local_68._12_4_;
    goto LAB_0019fc5c;
  }
LAB_0019fc37:
  if (local_50 == (uint *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar22 = "non-";
    if (this->_is_shared != false) {
      pcVar22 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes(): Invalid specified axes order \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar22,"unsigned int",axes_order);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __return_storage_ptr__->_width = local_68._0_4_;
  __return_storage_ptr__->_height = local_68._4_4_;
  __return_storage_ptr__->_depth = local_68._8_4_;
  __return_storage_ptr__->_spectrum = local_68._12_4_;
LAB_0019fc5c:
  local_68 = (undefined1  [16])0x0;
  __return_storage_ptr__->_data = local_50;
  local_50 = (uint *)0x0;
  __return_storage_ptr__->_is_shared = local_58;
  local_58 = false;
LAB_0019fc75:
  if (local_50 != (uint *)0x0) {
    operator_delete__(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _permute_axes(const char *const axes_order, const t&) const {
      if (is_empty() || !axes_order) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      unsigned char s_code[4] = { 0,1,2,3 }, n_code[4] = { 0 };
      for (unsigned int l = 0; axes_order[l]; ++l) {
        int c = cimg::lowercase(axes_order[l]);
        if (l>=4 || (c!='x' && c!='y' && c!='z' && c!='c')) { *s_code = 4; break; }
        else { ++n_code[c%=4]; s_code[l] = c; }
      }
      if (*axes_order && *s_code<4 && *n_code<=1 && n_code[1]<=1 && n_code[2]<=1 && n_code[3]<=1) {
        const unsigned int code = (s_code[0]<<12) | (s_code[1]<<8) | (s_code[2]<<4) | (s_code[3]);
        ulongT wh, whd;
        switch (code) {
        case 0x0123 : // xyzc
          return +*this;
        case 0x0132 : // xycz
          res.assign(_width,_height,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0213 : // xzyc
          res.assign(_width,_depth,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0231 : // xzcy
          res.assign(_width,_depth,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0312 : // xcyz
          res.assign(_width,_spectrum,_height,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0321 : // xczy
          res.assign(_width,_spectrum,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1023 : // yxzc
          res.assign(_height,_width,_depth,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1032 : // yxcz
          res.assign(_height,_width,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1203 : // yzxc
          res.assign(_height,_depth,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1230 : // yzcx
          res.assign(_height,_depth,_spectrum,_width);
          switch (_width) {
          case 1 : {
            t *ptr_r = res.data(0,0,0,0);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)*(ptrs++);
            }
          } break;
          case 2 : {
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              ptrs+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              ptrs+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
            t
              *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1),
              *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              *(ptr_a++) = (t)ptrs[3];
              ptrs+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
            return res;
          }
          }
          break;
        case 0x1302 : // ycxz
          res.assign(_height,_spectrum,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1320 : // yczx
          res.assign(_height,_spectrum,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2013 : // zxyc
          res.assign(_depth,_width,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2031 : // zxcy
          res.assign(_depth,_width,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2103 : // zyxc
          res.assign(_depth,_height,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2130 : // zycx
          res.assign(_depth,_height,_spectrum,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2301 : // zcxy
          res.assign(_depth,_spectrum,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2310 : // zcyx
          res.assign(_depth,_spectrum,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3012 : // cxyz
          res.assign(_spectrum,_width,_height,_depth);
          switch (_spectrum) {
          case 1 : {
            const T *ptr_r = data(0,0,0,0);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) *(ptrd++) = (t)*(ptr_r++);
          } break;
          case 2 : {
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd[3] = (t)*(ptr_a++);
              ptrd+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
          }
          }
          break;
        case 0x3021 : // cxzy
          res.assign(_spectrum,_width,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3102 : // cyxz
          res.assign(_spectrum,_height,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3120 : // cyzx
          res.assign(_spectrum,_height,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3201 : // czxy
          res.assign(_spectrum,_depth,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3210 : // czyx
          res.assign(_spectrum,_depth,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
          break;
        }
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes(): Invalid specified axes order '%s'.",
                                    cimg_instance,
                                    axes_order);
      return res;
    }